

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_sse2.c
# Opt level: O0

uint64_t SharpYuvUpdateY_SSE2(uint16_t *ref,uint16_t *src,uint16_t *dst,int len,int bit_depth)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  uint16_t uVar10;
  int iVar11;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  undefined1 auVar12 [16];
  int new_y;
  int diff_y;
  __m128i I;
  __m128i H;
  __m128i G;
  __m128i F;
  __m128i E;
  __m128i D;
  __m128i C;
  __m128i B;
  __m128i A;
  __m128i sum;
  __m128i one;
  __m128i max;
  __m128i zero;
  int i;
  uint32_t tmp [4];
  uint64_t diff;
  int max_y;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_248;
  undefined8 uStack_240;
  int local_1fc;
  undefined1 local_1f8 [16];
  ulong local_1e8;
  int local_1dc;
  int local_1d4;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined2 local_1a4;
  short local_1a2;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  ulong local_118;
  ulong uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ushort local_f8;
  ushort uStack_f6;
  ushort uStack_f4;
  ushort uStack_f2;
  ushort uStack_f0;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  short local_38;
  short local_36;
  short local_34;
  short local_32;
  short local_30;
  short local_2e;
  short local_2c;
  short local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_1dc = (1 << (in_R8B & 0x1f)) + -1;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a2 = (short)local_1dc;
  local_2a = (short)local_1dc;
  local_2c = (short)local_1dc;
  local_2e = (short)local_1dc;
  local_30 = (short)local_1dc;
  local_32 = (short)local_1dc;
  local_34 = (short)local_1dc;
  local_36 = (short)local_1dc;
  local_38 = (short)local_1dc;
  local_48 = CONCAT26((short)local_1dc,
                      CONCAT24((short)local_1dc,CONCAT22((short)local_1dc,(short)local_1dc)));
  uStack_40 = CONCAT26((short)local_1dc,
                       CONCAT24((short)local_1dc,CONCAT22((short)local_1dc,(short)local_1dc)));
  local_1a4 = 1;
  local_2 = 1;
  local_4 = 1;
  local_6 = 1;
  local_8 = 1;
  local_a = 1;
  local_c = 1;
  local_e = 1;
  local_10 = 1;
  local_28 = 0x1000100010001;
  uStack_20 = 0x1000100010001;
  local_248 = 0;
  uStack_240 = 0;
  for (local_1fc = 0; uVar2 = uStack_50, uVar1 = local_58, local_58._0_4_ = (int)local_248,
      local_58._4_4_ = (int)((ulong)local_248 >> 0x20), uStack_50._0_4_ = (int)uStack_240,
      uStack_50._4_4_ = (int)((ulong)uStack_240 >> 0x20), local_1fc + 8 <= in_ECX;
      local_1fc = local_1fc + 8) {
    local_190 = (undefined8 *)(in_RDI + (long)local_1fc * 2);
    uVar1 = *local_190;
    uVar2 = local_190[1];
    local_198 = (undefined8 *)(in_RSI + (long)local_1fc * 2);
    uVar3 = *local_198;
    uVar4 = local_198[1];
    local_1a0 = (undefined8 *)(in_RDX + (long)local_1fc * 2);
    uVar5 = *local_1a0;
    uVar6 = local_1a0[1];
    local_178._0_2_ = (short)uVar1;
    local_178._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_178._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_178._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_170._0_2_ = (short)uVar2;
    uStack_170._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_170._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_170._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_188._0_2_ = (short)uVar3;
    local_188._2_2_ = (short)((ulong)uVar3 >> 0x10);
    local_188._4_2_ = (short)((ulong)uVar3 >> 0x20);
    local_188._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_180._0_2_ = (short)uVar4;
    uStack_180._2_2_ = (short)((ulong)uVar4 >> 0x10);
    uStack_180._4_2_ = (short)((ulong)uVar4 >> 0x20);
    uStack_180._6_2_ = (short)((ulong)uVar4 >> 0x30);
    local_178._0_2_ = (short)local_178 - (short)local_188;
    local_178._2_2_ = local_178._2_2_ - local_188._2_2_;
    local_178._4_2_ = local_178._4_2_ - local_188._4_2_;
    local_178._6_2_ = local_178._6_2_ - local_188._6_2_;
    uStack_170._0_2_ = (short)uStack_170 - (short)uStack_180;
    uStack_170._2_2_ = uStack_170._2_2_ - uStack_180._2_2_;
    uStack_170._4_2_ = uStack_170._4_2_ - uStack_180._4_2_;
    uStack_170._6_2_ = uStack_170._6_2_ - uStack_180._6_2_;
    local_158 = 0;
    uStack_150 = 0;
    local_168 = CONCAT26(local_178._6_2_,
                         CONCAT24(local_178._4_2_,CONCAT22(local_178._2_2_,(short)local_178)));
    uStack_160 = CONCAT26(uStack_170._6_2_,
                          CONCAT24(uStack_170._4_2_,CONCAT22(uStack_170._2_2_,(short)uStack_170)));
    local_148 = CONCAT26(local_178._6_2_,
                         CONCAT24(local_178._4_2_,CONCAT22(local_178._2_2_,(short)local_178)));
    uStack_140 = CONCAT26(uStack_170._6_2_,
                          CONCAT24(uStack_170._4_2_,CONCAT22(uStack_170._2_2_,(short)uStack_170)));
    local_138._0_2_ = (short)uVar5;
    local_138._2_2_ = (short)((ulong)uVar5 >> 0x10);
    local_138._4_2_ = (short)((ulong)uVar5 >> 0x20);
    local_138._6_2_ = (short)((ulong)uVar5 >> 0x30);
    uStack_130._0_2_ = (short)uVar6;
    uStack_130._2_2_ = (short)((ulong)uVar6 >> 0x10);
    uStack_130._4_2_ = (short)((ulong)uVar6 >> 0x20);
    uStack_130._6_2_ = (short)((ulong)uVar6 >> 0x30);
    local_138._0_2_ = (short)local_138 + (short)local_178;
    local_138._2_2_ = local_138._2_2_ + local_178._2_2_;
    local_138._4_2_ = local_138._4_2_ + local_178._4_2_;
    local_138._6_2_ = local_138._6_2_ + local_178._6_2_;
    uStack_130._0_2_ = (short)uStack_130 + (short)uStack_170;
    uStack_130._2_2_ = uStack_130._2_2_ + uStack_170._2_2_;
    uStack_130._4_2_ = uStack_130._4_2_ + uStack_170._4_2_;
    uStack_130._6_2_ = uStack_130._6_2_ + uStack_170._6_2_;
    local_118 = CONCAT26(-(ushort)(local_178._6_2_ < 0),
                         CONCAT24(-(ushort)(local_178._4_2_ < 0),
                                  CONCAT22(-(ushort)(local_178._2_2_ < 0),
                                           -(ushort)((short)local_178 < 0))));
    uStack_110 = CONCAT26(-(ushort)(uStack_170._6_2_ < 0),
                          CONCAT24(-(ushort)(uStack_170._4_2_ < 0),
                                   CONCAT22(-(ushort)(uStack_170._2_2_ < 0),
                                            -(ushort)((short)uStack_170 < 0))));
    local_c8 = local_118 | 0x1000100010001;
    uStack_c0 = uStack_110 | 0x1000100010001;
    local_d8 = CONCAT26(local_138._6_2_,
                        CONCAT24(local_138._4_2_,CONCAT22(local_138._2_2_,(short)local_138)));
    uStack_d0 = CONCAT26(uStack_130._6_2_,
                         CONCAT24(uStack_130._4_2_,CONCAT22(uStack_130._2_2_,(short)uStack_130)));
    local_f8 = (ushort)((short)local_1dc < (short)local_138) * (short)local_1dc |
               (ushort)((short)local_1dc >= (short)local_138) * (short)local_138;
    uStack_f6 = (ushort)((short)local_1dc < local_138._2_2_) * (short)local_1dc |
                (ushort)((short)local_1dc >= local_138._2_2_) * local_138._2_2_;
    uStack_f4 = (ushort)((short)local_1dc < local_138._4_2_) * (short)local_1dc |
                (ushort)((short)local_1dc >= local_138._4_2_) * local_138._4_2_;
    uStack_f2 = (ushort)((short)local_1dc < local_138._6_2_) * (short)local_1dc |
                (ushort)((short)local_1dc >= local_138._6_2_) * local_138._6_2_;
    uStack_f0 = (ushort)((short)local_1dc < (short)uStack_130) * (short)local_1dc |
                (ushort)((short)local_1dc >= (short)uStack_130) * (short)uStack_130;
    uStack_ee = (ushort)((short)local_1dc < uStack_130._2_2_) * (short)local_1dc |
                (ushort)((short)local_1dc >= uStack_130._2_2_) * uStack_130._2_2_;
    uStack_ec = (ushort)((short)local_1dc < uStack_130._4_2_) * (short)local_1dc |
                (ushort)((short)local_1dc >= uStack_130._4_2_) * uStack_130._4_2_;
    uStack_ea = (ushort)((short)local_1dc < uStack_130._6_2_) * (short)local_1dc |
                (ushort)((short)local_1dc >= uStack_130._6_2_) * uStack_130._6_2_;
    local_108 = 0;
    uStack_100 = 0;
    local_b8 = CONCAT26(local_178._6_2_,
                        CONCAT24(local_178._4_2_,CONCAT22(local_178._2_2_,(short)local_178)));
    uStack_b0 = CONCAT26(uStack_170._6_2_,
                         CONCAT24(uStack_170._4_2_,CONCAT22(uStack_170._2_2_,(short)uStack_170)));
    auVar9._8_8_ = uStack_b0;
    auVar9._0_8_ = local_b8;
    auVar12._8_8_ = uStack_c0;
    auVar12._0_8_ = local_c8;
    auVar12 = pmaddwd(auVar9,auVar12);
    local_70 = (undefined8 *)(in_RDX + (long)local_1fc * 2);
    local_88 = CONCAT26((-1 < (short)uStack_f2) * uStack_f2,
                        CONCAT24((-1 < (short)uStack_f4) * uStack_f4,
                                 CONCAT22((-1 < (short)uStack_f6) * uStack_f6,
                                          (-1 < (short)local_f8) * local_f8)));
    uStack_80 = CONCAT26((-1 < (short)uStack_ea) * uStack_ea,
                         CONCAT24((-1 < (short)uStack_ec) * uStack_ec,
                                  CONCAT22((-1 < (short)uStack_ee) * uStack_ee,
                                           (-1 < (short)uStack_f0) * uStack_f0)));
    *local_70 = local_88;
    local_70[1] = uStack_80;
    uVar7 = local_248;
    uVar8 = uStack_240;
    local_2d8 = auVar12._0_8_;
    uStack_2d0 = auVar12._8_8_;
    local_68._0_4_ = auVar12._0_4_;
    local_68._4_4_ = auVar12._4_4_;
    uStack_60._0_4_ = auVar12._8_4_;
    uStack_60._4_4_ = auVar12._12_4_;
    local_248 = CONCAT44(local_58._4_4_ + local_68._4_4_,(int)local_58 + (int)local_68);
    uStack_240 = CONCAT44(uStack_50._4_4_ + uStack_60._4_4_,(int)uStack_50 + (int)uStack_60);
    local_188 = uVar3;
    uStack_180 = uVar4;
    local_178 = uVar1;
    uStack_170 = uVar2;
    local_138 = uVar5;
    uStack_130 = uVar6;
    local_128 = local_28;
    uStack_120 = uStack_20;
    local_e8 = local_48;
    uStack_e0 = uStack_40;
    local_68 = local_2d8;
    uStack_60 = uStack_2d0;
    local_58 = uVar7;
    uStack_50 = uVar8;
  }
  local_90 = local_1f8;
  local_a8 = local_248;
  uStack_a0 = uStack_240;
  local_1e8 = (ulong)(uint)(uStack_50._4_4_ + (int)uStack_50 + local_58._4_4_ + (int)local_58);
  local_1d4 = in_ECX;
  local_1d0 = in_RDX;
  local_1c8 = in_RSI;
  local_1c0 = in_RDI;
  local_58 = uVar1;
  uStack_50 = uVar2;
  for (; local_1fc < local_1d4; local_1fc = local_1fc + 1) {
    iVar11 = (uint)*(ushort *)(local_1c0 + (long)local_1fc * 2) -
             (uint)*(ushort *)(local_1c8 + (long)local_1fc * 2);
    uVar10 = clip_SSE2((uint)*(ushort *)(local_1d0 + (long)local_1fc * 2) + iVar11,local_1dc);
    *(uint16_t *)(local_1d0 + (long)local_1fc * 2) = uVar10;
    if (iVar11 < 1) {
      iVar11 = -iVar11;
    }
    local_1e8 = (long)iVar11 + local_1e8;
  }
  return local_1e8;
}

Assistant:

static uint64_t SharpYuvUpdateY_SSE2(const uint16_t* ref, const uint16_t* src,
                                     uint16_t* dst, int len, int bit_depth) {
  const int max_y = (1 << bit_depth) - 1;
  uint64_t diff = 0;
  uint32_t tmp[4];
  int i;
  const __m128i zero = _mm_setzero_si128();
  const __m128i max = _mm_set1_epi16(max_y);
  const __m128i one = _mm_set1_epi16(1);
  __m128i sum = zero;

  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i A = _mm_loadu_si128((const __m128i*)(ref + i));
    const __m128i B = _mm_loadu_si128((const __m128i*)(src + i));
    const __m128i C = _mm_loadu_si128((const __m128i*)(dst + i));
    const __m128i D = _mm_sub_epi16(A, B);       // diff_y
    const __m128i E = _mm_cmpgt_epi16(zero, D);  // sign (-1 or 0)
    const __m128i F = _mm_add_epi16(C, D);       // new_y
    const __m128i G = _mm_or_si128(E, one);      // -1 or 1
    const __m128i H = _mm_max_epi16(_mm_min_epi16(F, max), zero);
    const __m128i I = _mm_madd_epi16(D, G);      // sum(abs(...))
    _mm_storeu_si128((__m128i*)(dst + i), H);
    sum = _mm_add_epi32(sum, I);
  }
  _mm_storeu_si128((__m128i*)tmp, sum);
  diff = tmp[3] + tmp[2] + tmp[1] + tmp[0];
  for (; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip_SSE2(new_y, max_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}